

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

size_t __thiscall
google::protobuf::internal::ExtensionSet::GetMessageByteSizeLong(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  size_t sVar2;
  string *psVar3;
  LogMessageFatal *pLVar4;
  LogMessageFatal aLStack_18 [16];
  
  pLVar4 = aLStack_18;
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x206,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_18,0xb,"not present");
    goto LAB_0013a7d9;
  }
  if (pEVar1->is_repeated == false) {
    psVar3 = (string *)0x0;
  }
  else {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar3 == (string *)0x0) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      GetMessageByteSizeLong();
LAB_0013a7ad:
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar4,10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    else {
      pLVar4 = (LogMessageFatal *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
      if (pLVar4 != (LogMessageFatal *)0xa) goto LAB_0013a7ad;
      psVar3 = (string *)0x0;
    }
    if (psVar3 == (string *)0x0) {
      if ((pEVar1->field_0xa & 4) == 0) {
        sVar2 = (**(code **)(*(long *)pEVar1->field_0 + 0x18))();
        return sVar2;
      }
      sVar2 = (**(code **)(*(long *)pEVar1->field_0 + 0x68))();
      return sVar2;
    }
  }
  else {
    GetMessageByteSizeLong();
  }
  GetMessageByteSizeLong();
LAB_0013a7d9:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

size_t ExtensionSet::GetMessageByteSizeLong(int number) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "not present";
  ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
  return extension->is_lazy ? extension->ptr.lazymessage_value->ByteSizeLong()
                            : extension->ptr.message_value->ByteSizeLong();
}